

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsTTDStart(void)

{
  bool bVar1;
  JsErrorCode JVar2;
  ScriptContext *local_20;
  ScriptContext *scriptContext;
  JsrtContext *pJStack_10;
  JsErrorCode cCheck;
  JsrtContext *currentContext;
  
  pJStack_10 = JsrtContext::GetCurrent();
  scriptContext._4_4_ = CheckContext(pJStack_10,false,false);
  if (scriptContext._4_4_ != JsNoError) {
    TTDAbort_unrecoverable_error("Must have valid context when starting TTD.");
  }
  local_20 = JsrtContext::GetScriptContext(pJStack_10);
  bVar1 = Js::ScriptContext::IsTTDRecordOrReplayModeEnabled(local_20);
  if (!bVar1) {
    TTDAbort_unrecoverable_error("Need to create in TTD Record Mode.");
  }
  JVar2 = GlobalAPIWrapper_NoRecord<JsTTDStart::__0>((anon_class_8_1_1b6df084)&local_20);
  return JVar2;
}

Assistant:

CHAKRA_API JsTTDStart()
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtContext *currentContext = JsrtContext::GetCurrent();
    JsErrorCode cCheck = CheckContext(currentContext, JSRT_MAYBE_TRUE);
    TTDAssert(cCheck == JsNoError, "Must have valid context when starting TTD.");

    Js::ScriptContext* scriptContext = currentContext->GetScriptContext();
    TTDAssert(scriptContext->IsTTDRecordOrReplayModeEnabled(), "Need to create in TTD Record Mode.");
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        if(scriptContext->IsTTDRecordModeEnabled())
        {
            scriptContext->GetThreadContext()->TTDLog->DoSnapshotExtract();
        }

        //Want to verify that we are at top-level of dispatch
        scriptContext->GetThreadContext()->TTDLog->PushMode(TTD::TTDMode::CurrentlyEnabled);

        return JsNoError;
    });
#endif
}